

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void find_suite::find_if(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  reference piVar2;
  ulong uVar3;
  circular_view<int,_18446744073709551615UL> *pcVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  basic_iterator<int> local_98;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  view_pointer local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> local_58;
  type local_38 [4];
  
  local_58.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_58.member.cap = 4;
  local_58.member.size = 0;
  local_58.member.next = 4;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_80;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_58,input);
  uVar1 = local_58.member.cap * 2;
  uVar3 = uVar1 - (local_58.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    local_98.current = uVar1 - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    local_98.current = (local_58.member.next - local_58.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    piVar6 = (int *)(uVar1 - 1 & local_58.member.next);
  }
  else {
    piVar6 = (int *)(local_58.member.next % uVar1);
  }
  lVar5 = (long)((long)piVar6 - local_98.current) >> 2;
  local_98.parent = &local_58;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98.parent;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_80);
      pcVar4 = local_98.parent;
      piVar7 = (int *)local_98.current;
      if (0x16 < *piVar2) goto LAB_0010403b;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98.parent;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_80);
      pcVar4 = local_98.parent;
      piVar7 = (int *)local_98.current;
      if (0x16 < *piVar2) goto LAB_0010403b;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98.parent;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_80);
      pcVar4 = local_98.parent;
      piVar7 = (int *)local_98.current;
      if (0x16 < *piVar2) goto LAB_0010403b;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98.parent;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_80);
      pcVar4 = local_98.parent;
      piVar7 = (int *)local_98.current;
      if (0x16 < *piVar2) goto LAB_0010403b;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)piVar6 - local_98.current;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar4 = &local_58;
      piVar7 = piVar6;
      if (lVar5 != 3) goto LAB_0010403b;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98.parent;
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         ((basic_iterator<int> *)&local_80);
      pcVar4 = local_98.parent;
      piVar7 = (int *)local_98.current;
      if (0x16 < *piVar2) goto LAB_0010403b;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    }
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_98.parent;
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)local_98.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       ((basic_iterator<int> *)&local_80);
    pcVar4 = local_98.parent;
    piVar7 = (int *)local_98.current;
    if (0x16 < *piVar2) goto LAB_0010403b;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
  }
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_98.parent;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_98.current;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_80);
  pcVar4 = local_98.parent;
  piVar7 = (int *)local_98.current;
  if (*piVar2 < 0x17) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    pcVar4 = &local_58;
    piVar7 = piVar6;
  }
LAB_0010403b:
  local_98.parent = (view_pointer)0x2c00000021;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
  uVar1 = local_58.member.cap * 2;
  if ((uVar1 & local_58.member.cap * 2 - 1) == 0) {
    sStack_60 = uVar1 - 1 & local_58.member.next;
  }
  else {
    sStack_60 = local_58.member.next % uVar1;
  }
  local_68 = &local_58;
  first_end.current = sStack_60;
  first_end.parent = local_68;
  first_begin.current = (size_type)piVar7;
  first_begin.parent = pcVar4;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x13e,"void find_suite::find_if()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto where = std::find_if(span.begin(), span.end(), [](int value){ return value > 22; });
    {
        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}